

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT<double>(TPZMultiphysicsElement *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  int64_t iVar5;
  long *plVar6;
  ulong uVar7;
  TPZConnect *this_00;
  TPZConnect *this_01;
  TPZFMatrix<double> *this_02;
  TPZFMatrix<double> *row;
  double *pdVar8;
  long *in_RDI;
  int iload;
  int ibl;
  TPZFMatrix<double> *meshSol;
  TPZFMatrix<double> *celSol;
  int posloc;
  int pos;
  int blsz;
  int64_t seqloc;
  int64_t seq;
  TPZConnect *conloc;
  TPZConnect *con;
  int iconloc;
  int ncon;
  TPZCompEl *cel;
  int imesh;
  int nload;
  int icon;
  int nmeshes;
  TPZCompEl *in_stack_00000160;
  int in_stack_ffffffffffffff7c;
  TPZSolutionMatrix *in_stack_ffffffffffffff80;
  int iVar9;
  int iVar10;
  int local_28;
  int local_18;
  int local_10;
  
  iVar1 = (**(code **)(*in_RDI + 0x270))();
  local_10 = 0;
  pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
  TPZCompMesh::Solution(pTVar4);
  iVar5 = TPZSolutionMatrix::Cols((TPZSolutionMatrix *)0x1bcac4b);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    plVar6 = (long *)(**(code **)(*in_RDI + 0x268))(in_RDI,(long)local_18);
    if ((plVar6 != (long *)0x0) &&
       (uVar7 = (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_18), (uVar7 & 1) != 0)) {
      iVar2 = (**(code **)(*plVar6 + 0x90))();
      for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
        this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_10);
        this_01 = (TPZConnect *)(**(code **)(*plVar6 + 0xa8))(plVar6,local_28);
        TPZConnect::SequenceNumber(this_00);
        TPZConnect::SequenceNumber(this_01);
        pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
        TPZCompMesh::Block(pTVar4);
        iVar3 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
        TPZCompMesh::Block(pTVar4);
        TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
        TPZCompMesh::Block(pTVar4);
        TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
        TPZCompMesh::Solution(pTVar4);
        this_02 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff80);
        pTVar4 = TPZCompEl::Mesh(in_stack_00000160);
        TPZCompMesh::Solution(pTVar4);
        row = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff80);
        for (iVar10 = 0; iVar10 < iVar3; iVar10 = iVar10 + 1) {
          for (iVar9 = 0; iVar9 < (int)iVar5; iVar9 = iVar9 + 1) {
            pdVar8 = TPZFMatrix<double>::operator()(this_02,(int64_t)row,CONCAT44(iVar10,iVar9));
            in_stack_ffffffffffffff80 = (TPZSolutionMatrix *)*pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()(this_02,(int64_t)row,CONCAT44(iVar10,iVar9));
            *pdVar8 = (double)in_stack_ffffffffffffff80;
          }
        }
        local_10 = local_10 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT()
{
    int nmeshes = this->NMeshes();
    int icon = 0;
    int nload = this->Mesh()->Solution().Cols();
    for (int imesh = 0; imesh < nmeshes; imesh++) {
        TPZCompEl *cel = this->ReferredElement(imesh);
        if (!cel) {
            continue;
        }
        if(!this->IsActiveApproxSpaces(imesh)){
            continue;
        }
        int ncon = cel->NConnects();
        for (int iconloc = 0; iconloc < ncon; iconloc++, icon++) {
            TPZConnect &con = this->Connect(icon);
            TPZConnect &conloc = cel->Connect(iconloc);
            int64_t seq = con.SequenceNumber();
            int64_t seqloc = conloc.SequenceNumber();
            int blsz = this->Mesh()->Block().Size(seq);

#ifdef PZDEBUG
            int blszloc = cel->Mesh()->Block().Size(seqloc);
            if (blsz != blszloc) {
                DebugStop();
            }
#endif
            int pos = this->Mesh()->Block().Position(seq);
            int posloc = cel->Mesh()->Block().Position(seqloc);
            TPZFMatrix<TVar> &celSol = cel->Mesh()->Solution();
            TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();
            for (int ibl = 0; ibl < blsz; ibl++) {
                for (int iload = 0; iload < nload; iload++) {
                    celSol(posloc+ibl,iload) = meshSol(pos+ibl,iload);
                }

            }
        }
    }
}